

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator.hpp
# Opt level: O0

void __thiscall boost::unit_test::decorator::timeout::~timeout(timeout *this)

{
  void *in_RDI;
  
  ~timeout((timeout *)0x248178);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

class BOOST_TEST_DECL timeout : public decorator::base {
public:
    explicit                timeout( unsigned t ) : m_timeout( t ) {}

private:
    // decorator::base interface
    virtual void            apply( test_unit& tu );
    virtual base_ptr        clone() const { return base_ptr(new timeout( m_timeout )); }

    // Data members
    unsigned                m_timeout;
}